

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O0

clock_update_t *
tchecker::operator+(clock_update_t *__return_storage_ptr__,clock_update_t *u,
                   shared_ptr<const_tchecker::expression_t> *expr)

{
  clock_id_t clock_id;
  undefined1 local_44 [20];
  shared_ptr<const_tchecker::expression_t> local_30;
  shared_ptr<const_tchecker::expression_t> *local_20;
  shared_ptr<const_tchecker::expression_t> *expr_local;
  clock_update_t *u_local;
  
  clock_id = u->_clock_id;
  local_44._0_4_ = 8;
  local_20 = expr;
  expr_local = (shared_ptr<const_tchecker::expression_t> *)u;
  u_local = __return_storage_ptr__;
  std::
  make_shared<tchecker::binary_expression_t,tchecker::binary_operator_t,std::shared_ptr<tchecker::expression_t_const>const&,std::shared_ptr<tchecker::expression_t_const>const&>
            ((binary_operator_t *)(local_44 + 4),
             (shared_ptr<const_tchecker::expression_t> *)local_44,&u->_value);
  std::shared_ptr<tchecker::expression_t_const>::shared_ptr<tchecker::binary_expression_t,void>
            ((shared_ptr<tchecker::expression_t_const> *)&local_30,
             (shared_ptr<tchecker::binary_expression_t> *)(local_44 + 4));
  clock_update_t::clock_update_t(__return_storage_ptr__,clock_id,&local_30);
  std::shared_ptr<const_tchecker::expression_t>::~shared_ptr(&local_30);
  std::shared_ptr<tchecker::binary_expression_t>::~shared_ptr
            ((shared_ptr<tchecker::binary_expression_t> *)(local_44 + 4));
  return __return_storage_ptr__;
}

Assistant:

tchecker::clock_update_t operator+(tchecker::clock_update_t const & u,
                                   std::shared_ptr<tchecker::expression_t const> const & expr)
{
  return tchecker::clock_update_t{u._clock_id,
                                  std::make_shared<tchecker::binary_expression_t>(tchecker::EXPR_OP_PLUS, u._value, expr)};
}